

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

int envy_bios_parse_mem_train(envy_bios *bios)

{
  uint8_t *puVar1;
  ushort uVar2;
  envy_bios_mem_train_entry *peVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  envy_bios_mem_train_entry *peVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  
  uVar2 = (bios->mem).train.offset;
  iVar11 = 0;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      (bios->mem).train.version = bios->data[(uint)uVar2];
      iVar11 = 0;
    }
    else {
      (bios->mem).train.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar11 = -0xe;
    }
    lVar10 = (ulong)(bios->mem).train.offset + 1;
    if ((uint)lVar10 < bios->length) {
      (bios->mem).train.hlen = bios->data[lVar10];
      iVar12 = 0;
    }
    else {
      (bios->mem).train.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar12 = -0xe;
    }
    lVar10 = (ulong)(bios->mem).train.offset + 2;
    if ((uint)lVar10 < bios->length) {
      (bios->mem).train.rlen = bios->data[lVar10];
      iVar4 = 0;
    }
    else {
      (bios->mem).train.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    lVar10 = (ulong)(bios->mem).train.offset + 3;
    if ((uint)lVar10 < bios->length) {
      (bios->mem).train.subentrylen = bios->data[lVar10];
      iVar5 = 0;
    }
    else {
      (bios->mem).train.subentrylen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar5 = -0xe;
    }
    lVar10 = (ulong)(bios->mem).train.offset + 4;
    puVar1 = &(bios->mem).train.subentries;
    if ((uint)lVar10 < bios->length) {
      (bios->mem).train.subentries = bios->data[lVar10];
      iVar6 = 0;
    }
    else {
      *puVar1 = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar6 = -0xe;
    }
    lVar10 = (ulong)(bios->mem).train.offset + 5;
    if ((uint)lVar10 < bios->length) {
      (bios->mem).train.entriesnum = bios->data[lVar10];
      iVar7 = 0;
    }
    else {
      (bios->mem).train.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar7 = -0xe;
    }
    if (((((iVar12 == 0 && iVar11 == 0) && iVar4 == 0) && iVar5 == 0) && iVar6 == 0) && iVar7 == 0)
    {
      uVar14 = (ulong)(bios->mem).train.offset;
      lVar10 = uVar14 + 7;
      if ((uint)lVar10 < bios->length) {
        (bios->mem).train.mclk = CONCAT11(bios->data[lVar10],bios->data[uVar14 + 6]);
      }
      else {
        (bios->mem).train.mclk = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      }
      envy_bios_block(bios,(uint)(bios->mem).train.offset,
                      (uint)(bios->mem).train.entriesnum * (uint)(bios->mem).train.rlen +
                      (uint)(bios->mem).train.hlen,"MEM TRAIN",-1);
      peVar9 = (envy_bios_mem_train_entry *)calloc((ulong)(bios->mem).train.entriesnum,0xc);
      (bios->mem).train.entries = peVar9;
      if (peVar9 == (envy_bios_mem_train_entry *)0x0) {
        iVar11 = -0xc;
      }
      else {
        if ((bios->mem).train.entriesnum != '\0') {
          lVar10 = 3;
          uVar14 = 0;
          uVar15 = 0;
          do {
            peVar3 = (bios->mem).train.entries;
            peVar9 = peVar3 + uVar14;
            uVar8 = (int)uVar14 *
                    ((uint)(bios->mem).train.subentrylen * (uint)(bios->mem).train.subentries +
                    (uint)(bios->mem).train.rlen) +
                    (uint)(bios->mem).train.hlen + (uint)(bios->mem).train.offset;
            peVar9->offset = (uint16_t)uVar8;
            uVar8 = uVar8 & 0xffff;
            if (uVar8 < bios->length) {
              peVar9->u00 = bios->data[uVar8];
              uVar8 = 0;
            }
            else {
              peVar9->u00 = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              uVar8 = 0xfffffff2;
            }
            uVar15 = uVar8 | uVar15;
            if (*puVar1 < 9) {
              if (*puVar1 != '\0') {
                uVar13 = 1;
                do {
                  if ((uint)peVar9->offset + (int)uVar13 < bios->length) {
                    peVar3->subentry[uVar13 + lVar10 + -4] = bios->data[uVar13 + peVar9->offset];
                    uVar8 = 0;
                  }
                  else {
                    peVar3->subentry[uVar13 + lVar10 + -4] = '\0';
                    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                    uVar8 = 0xfffffff2;
                  }
                  uVar15 = uVar15 | uVar8;
                  bVar16 = uVar13 < *puVar1;
                  uVar13 = uVar13 + 1;
                } while (bVar16);
              }
              bVar16 = uVar15 == 0;
            }
            else {
              envy_bios_parse_mem_train_cold_1();
              bVar16 = false;
            }
            if (!bVar16) goto LAB_0025b0ab;
            uVar14 = uVar14 + 1;
            lVar10 = lVar10 + 0xc;
          } while (uVar14 < (bios->mem).train.entriesnum);
        }
        (bios->mem).train.valid = '\x01';
        iVar11 = 0;
      }
    }
    else {
LAB_0025b0ab:
      iVar11 = -0xe;
    }
  }
  return iVar11;
}

Assistant:

int
envy_bios_parse_mem_train (struct envy_bios *bios) {
	struct envy_bios_mem_train *mt = &bios->mem.train;
	if (!mt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mt->offset, &mt->version);
	err |= bios_u8(bios, mt->offset+1, &mt->hlen);
	err |= bios_u8(bios, mt->offset+2, &mt->rlen);
	err |= bios_u8(bios, mt->offset+3, &mt->subentrylen);
	err |= bios_u8(bios, mt->offset+4, &mt->subentries);
	err |= bios_u8(bios, mt->offset+5, &mt->entriesnum);
	if (err)
		return -EFAULT;
	bios_u16(bios, mt->offset+6, &mt->mclk);

	envy_bios_block(bios, mt->offset, mt->hlen + mt->rlen * mt->entriesnum, "MEM TRAIN", -1);
	mt->entries = calloc(mt->entriesnum, sizeof *mt->entries);
	if (!mt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mt->entriesnum; i++) {
		struct envy_bios_mem_train_entry *entry = &mt->entries[i];
		entry->offset = mt->offset + mt->hlen + ((mt->rlen + mt->subentries * mt->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->u00);
		if (mt->subentries > sizeof(entry->subentry)) {
			mt->subentries = sizeof(entry->subentry);
			ENVY_BIOS_ERR("Error when parsing mem train: subentries = %d > %zu\n", mt->subentries, sizeof(entry->subentry));
			return -EFAULT;
		}
		int j;
		for (j = 0; j < mt->subentries; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &entry->subentry[j]);
		}
		if (err)
			return -EFAULT;
	}
	mt->valid = 1;
	return 0;
}